

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

aiVector3D __thiscall Assimp::XFileParser::ReadVector3(XFileParser *this)

{
  aiVector3D aVar1;
  XFileParser *this_local;
  ai_real aStack_10;
  aiVector3D vector;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&this_local + 4));
  this_local._4_4_ = ReadFloat(this);
  aStack_10 = ReadFloat(this);
  vector.x = ReadFloat(this);
  TestForSeparator(this);
  aVar1.y = aStack_10;
  aVar1.x = this_local._4_4_;
  aVar1.z = vector.x;
  return aVar1;
}

Assistant:

aiVector3D XFileParser::ReadVector3()
{
    aiVector3D vector;
    vector.x = ReadFloat();
    vector.y = ReadFloat();
    vector.z = ReadFloat();
    TestForSeparator();

    return vector;
}